

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_19bb9b::VirtualInputNodeTask::inputsAvailable
          (VirtualInputNodeTask *this,TaskInterface ti)

{
  ValueType local_a8;
  TaskInterface local_90;
  BuildValue local_80;
  
  local_90.ctx = ti.ctx;
  local_90.impl = ti.impl;
  local_80.kind = VirtualInput;
  local_80._4_8_ = 0;
  local_80._12_8_ = 0;
  local_80.valueData._4_8_ = 0;
  local_80.valueData._12_8_ = 0;
  local_80.valueData._20_8_ = 0;
  local_80.valueData._28_8_ = 0;
  local_80.valueData._36_8_ = 0;
  local_80.valueData._44_8_ = 0;
  local_80.valueData._52_8_ = 0;
  local_80.valueData._60_8_ = 0;
  local_80.valueData._68_8_ = 0;
  local_80.valueData._76_4_ = 0;
  local_80.stringValues.contents._0_4_ = 0;
  local_80.stringValues.contents._4_4_ = 0;
  local_80.stringValues.size = 0;
  llbuild::buildsystem::BuildValue::toData(&local_a8,&local_80);
  llbuild::core::TaskInterface::complete(&local_90,&local_a8,false);
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  llbuild::buildsystem::BuildValue::~BuildValue(&local_80);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    ti.complete(BuildValue::makeVirtualInput().toData());
  }